

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ConstantPaddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_constantpad(NeuralNetworkLayer *this)

{
  bool bVar1;
  ConstantPaddingLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_constantpad(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_constantpad(this);
    this_00 = (ConstantPaddingLayerParams *)operator_new(0x30);
    ConstantPaddingLayerParams::ConstantPaddingLayerParams(this_00);
    (this->layer_).constantpad_ = this_00;
  }
  return (ConstantPaddingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ConstantPaddingLayerParams* NeuralNetworkLayer::mutable_constantpad() {
  if (!has_constantpad()) {
    clear_layer();
    set_has_constantpad();
    layer_.constantpad_ = new ::CoreML::Specification::ConstantPaddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.constantPad)
  return layer_.constantpad_;
}